

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_ptr_tests.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_71cb::StatePointer_EqualityPtrAndState_Test::
~StatePointer_EqualityPtrAndState_Test(StatePointer_EqualityPtrAndState_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(StatePointer, EqualityPtrAndState) {
	Foo foo1;
	Foo foo2;
	state_ptr<Foo> p11{&foo1, 1};
	state_ptr<Foo> p12{&foo1, 2};
	state_ptr<Foo> p21{&foo2, 1};
	state_ptr<Foo> p22{&foo2, 2};

	EXPECT_NE(p11, p12);
	EXPECT_NE(p11, p21);
	EXPECT_NE(p11, p22);
}